

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int test_delete_oss_vpc(void)

{
  code *pcVar1;
  char *__s;
  OssAdminDeleteOssVpcRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1e9;
  int ret;
  HttpTestListener *local_1c8;
  HttpTestListener *listener;
  string local_1b8;
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [55];
  allocator<char> local_131;
  string local_130 [32];
  OssAdminDeleteOssVpcRequestType *local_110;
  OssAdmin *ossadmin;
  OssAdminDeleteOssVpcResponseType resp;
  OssAdminDeleteOssVpcRequestType req;
  
  aliyun::OssAdminDeleteOssVpcRequestType::OssAdminDeleteOssVpcRequestType
            ((OssAdminDeleteOssVpcRequestType *)((long)&resp.request_id.field_2 + 8));
  aliyun::OssAdminDeleteOssVpcResponseType::OssAdminDeleteOssVpcResponseType
            ((OssAdminDeleteOssVpcResponseType *)&ossadmin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,"cn-hangzhou",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_168,"my_appid",&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"my_secret",&local_191);
  pOVar2 = (OssAdminDeleteOssVpcRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_130,local_168,local_190);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  local_110 = pOVar2;
  if (pOVar2 == (OssAdminDeleteOssVpcRequestType *)0x0) {
    aliyun::OssAdminDeleteOssVpcResponseType::~OssAdminDeleteOssVpcResponseType
              ((OssAdminDeleteOssVpcResponseType *)&ossadmin);
    aliyun::OssAdminDeleteOssVpcRequestType::~OssAdminDeleteOssVpcRequestType
              ((OssAdminDeleteOssVpcRequestType *)((long)&resp.request_id.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)pOVar2,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetUseTls((OssAdmin *)local_110,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_delete_oss_vpc_response;
  local_1c8 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1e9);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1e9);
  HttpTestListener::Start(local_1c8);
  std::__cxx11::string::operator=((string *)(resp.request_id.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=((string *)(req.owner_account.field_2._M_local_buf + 8),"Region");
  std::__cxx11::string::operator=((string *)(req.region.field_2._M_local_buf + 8),"VpcId");
  std::__cxx11::string::operator=((string *)(req.vpc_id.field_2._M_local_buf + 8),"Label");
  aliyun::OssAdmin::DeleteOssVpc
            (local_110,(OssAdminDeleteOssVpcResponseType *)((long)&resp.request_id.field_2 + 8),
             (OssAdminErrorInfo *)&ossadmin);
  HttpTestListener::WaitComplete(local_1c8);
  pHVar3 = local_1c8;
  if (local_1c8 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_1c8);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_110;
  if (local_110 != (OssAdminDeleteOssVpcRequestType *)0x0) {
    aliyun::OssAdmin::~OssAdmin((OssAdmin *)local_110);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_delete_oss_vpc() {
  OssAdminDeleteOssVpcRequestType req;
  OssAdminDeleteOssVpcResponseType resp;
  OssAdmin* ossadmin = OssAdmin::CreateOssAdminClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ossadmin) return 0;
  ossadmin->SetProxyHost("127.0.0.1:12234");
  ossadmin->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_delete_oss_vpc_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.region = "Region";
  req.vpc_id = "VpcId";
  req.label = "Label";
  int ret = ossadmin->DeleteOssVpc(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ossadmin;
}